

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O1

void __thiscall
Lib::DHMap<unsigned_int,_Lib::Stack<unsigned_int>_*,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
          (DHMap<unsigned_int,_Lib::Stack<unsigned_int>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
           *this)

{
  Entry *pEVar1;
  ulong uVar2;
  
  pEVar1 = this->_entries;
  if (pEVar1 != (Entry *)0x0) {
    if ((long)this->_capacity == 0) {
      pEVar1->field_0 = (anon_union_4_2_6ecd024b_for_Entry_0)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      pEVar1->_key = GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pEVar1;
      return;
    }
    uVar2 = (long)this->_capacity * 0x10;
    if (uVar2 < 0x11) {
      pEVar1->field_0 = (anon_union_4_2_6ecd024b_for_Entry_0)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
      pEVar1->_key = GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pEVar1;
      return;
    }
    if (uVar2 < 0x19) {
      pEVar1->field_0 = (anon_union_4_2_6ecd024b_for_Entry_0)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
      pEVar1->_key = GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pEVar1;
      return;
    }
    if (uVar2 < 0x21) {
      pEVar1->field_0 = (anon_union_4_2_6ecd024b_for_Entry_0)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
      pEVar1->_key = GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pEVar1;
      return;
    }
    if (uVar2 < 0x31) {
      pEVar1->field_0 = (anon_union_4_2_6ecd024b_for_Entry_0)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
      pEVar1->_key = GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pEVar1;
      return;
    }
    if (0x40 < uVar2) {
      operator_delete(pEVar1,0x10);
      return;
    }
    pEVar1->field_0 = (anon_union_4_2_6ecd024b_for_Entry_0)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
    pEVar1->_key = GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pEVar1;
  }
  return;
}

Assistant:

~DHMap()
  {
    if(_entries) {
      ASS_EQ(_afterLast-_entries,_capacity);
      array_delete(_entries, _capacity);
      DEALLOC_KNOWN(_entries,_capacity*sizeof(Entry),"DHMap::Entry");
    }
  }